

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmintcls.cpp
# Opt level: O0

vm_obj_id_t __thiscall CVmObjClass::get_superclass(CVmObjClass *this,vm_obj_id_t param_2,int sc_idx)

{
  vm_meta_entry_t *pvVar1;
  uint in_EDX;
  undefined4 in_ESI;
  vm_meta_entry_t *entry;
  vm_obj_id_t local_4;
  
  pvVar1 = get_meta_entry((CVmObjClass *)CONCAT44(in_ESI,in_EDX));
  if (pvVar1 == (vm_meta_entry_t *)0x0) {
    local_4 = 0;
  }
  else {
    local_4 = (*pvVar1->meta_->_vptr_CVmMetaclass[9])(pvVar1->meta_,(ulong)in_EDX);
  }
  return local_4;
}

Assistant:

vm_obj_id_t CVmObjClass::get_superclass(VMG_ vm_obj_id_t, int sc_idx) const
{
    /* get my metaclass table entry */
    vm_meta_entry_t *entry = get_meta_entry(vmg0_);

    /* 
     *   if we have a valid entry, ask the metaclass object to retrieve the
     *   superclass 
     */
    if (entry != 0)
        return entry->meta_->get_supermeta(vmg_ sc_idx);
    else
        return VM_INVALID_OBJ;
}